

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::UpperInclusiveBetweenOperator,false,false,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  sel_t *psVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  
  if (count == 0) {
    lVar13 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    puVar5 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar6 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar7 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    psVar8 = false_sel->sel_vector;
    lVar13 = 0;
    uVar16 = 0;
    do {
      uVar19 = uVar16;
      if (psVar1 != (sel_t *)0x0) {
        uVar19 = (ulong)psVar1[uVar16];
      }
      uVar12 = uVar16;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar16];
      }
      uVar9 = uVar16;
      if (psVar3 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar3[uVar16];
      }
      uVar17 = uVar16;
      if (psVar4 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar4[uVar16];
      }
      if ((((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0))
          && ((puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)))
          ) && ((puVar7 == (unsigned_long *)0x0 ||
                ((puVar7[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))) {
        lVar11._0_4_ = adata[uVar12].months;
        lVar11._4_4_ = adata[uVar12].days;
        lVar18._0_4_ = bdata[uVar9].months;
        lVar18._4_4_ = bdata[uVar9].days;
        lVar10 = (lVar11 >> 0x20) + adata[uVar12].micros / 86400000000;
        lVar14 = adata[uVar12].micros % 86400000000;
        lVar15 = lVar10 % 0x1e;
        lVar21 = (long)(int)(undefined4)lVar11 + lVar10 / 0x1e;
        lVar11 = (lVar18 >> 0x20) + bdata[uVar9].micros / 86400000000;
        lVar20 = lVar11 % 0x1e;
        lVar11 = (long)(int)(undefined4)lVar18 + lVar11 / 0x1e;
        lVar10._0_4_ = cdata[uVar17].months;
        lVar10._4_4_ = cdata[uVar17].days;
        if ((lVar11 < lVar21) ||
           ((uVar12 = 1, lVar11 <= lVar21 &&
            ((lVar20 < lVar15 ||
             ((lVar20 <= lVar15 && (bdata[uVar9].micros % 86400000000 < lVar14)))))))) {
          lVar11 = (lVar10 >> 0x20) + cdata[uVar17].micros / 86400000000;
          lVar18 = lVar11 % 0x1e;
          lVar11 = (long)(int)(undefined4)lVar10 + lVar11 / 0x1e;
          uVar12 = 1;
          if (lVar21 <= lVar11) {
            if (lVar21 < lVar11) {
              uVar12 = 0;
            }
            else if (lVar15 <= lVar18) {
              uVar12 = (ulong)(cdata[uVar17].micros % 86400000000 < lVar14 && lVar18 <= lVar15);
            }
          }
        }
      }
      else {
        uVar12 = 1;
      }
      psVar8[lVar13] = (sel_t)uVar19;
      lVar13 = uVar12 + lVar13;
      uVar16 = uVar16 + 1;
    } while (count != uVar16);
  }
  return count - lVar13;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}